

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBuffers.cpp
# Opt level: O2

void __thiscall aeron::LogBuffers::LogBuffers(LogBuffers *this,char *filename)

{
  int32_t termLength;
  int32_t pageSize;
  long lVar1;
  int64_t iVar2;
  uint8_t *puVar3;
  __shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  this->_vptr_LogBuffers = (_func_int **)&PTR__LogBuffers_00170aa8;
  (this->m_memoryMappedFiles).
  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_memoryMappedFiles).
  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->m_buffers[0]._vptr_AtomicBuffer + lVar1) =
         &PTR__AtomicBuffer_0016f998;
    *(undefined8 *)((long)&this->m_buffers[0].m_buffer + lVar1) = 0;
    *(undefined4 *)((long)&this->m_buffers[0].m_length + lVar1) = 0;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  iVar2 = util::MemoryMappedFile::getFileSize(filename);
  util::MemoryMappedFile::mapExisting((MemoryMappedFile *)&_Stack_38,filename);
  std::__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_memoryMappedFiles).
              super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  puVar3 = util::MemoryMappedFile::getMemoryPtr
                     ((this->m_memoryMappedFiles).
                      super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  this->m_buffers[3].m_buffer = puVar3 + iVar2 + -0x1000;
  this->m_buffers[3].m_length = 0x1000;
  termLength = *(int32_t *)(puVar3 + iVar2 + -0xeec);
  pageSize = *(int32_t *)(puVar3 + iVar2 + -0xee8);
  concurrent::logbuffer::LogBufferDescriptor::checkTermLength(termLength);
  concurrent::logbuffer::LogBufferDescriptor::checkPageSize(pageSize);
  for (lVar1 = 0x28; lVar1 != 0x70; lVar1 = lVar1 + 0x18) {
    *(uint8_t **)((long)this->m_buffers + lVar1 + -0x20) = puVar3;
    *(int32_t *)((long)&((LogBuffers *)(this->m_buffers + -1))->_vptr_LogBuffers + lVar1) =
         termLength;
    puVar3 = puVar3 + termLength;
  }
  return;
}

Assistant:

LogBuffers::LogBuffers(const char *filename)
{
    const std::int64_t logLength = MemoryMappedFile::getFileSize(filename);

    m_memoryMappedFiles = MemoryMappedFile::mapExisting(filename);

    std::uint8_t *basePtr = m_memoryMappedFiles->getMemoryPtr();

    m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]
        .wrap(basePtr + (logLength - LogBufferDescriptor::LOG_META_DATA_LENGTH),
            LogBufferDescriptor::LOG_META_DATA_LENGTH);

    const std::int32_t termLength = LogBufferDescriptor::termLength(
        m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]);
    const std::int32_t pageSize = LogBufferDescriptor::pageSize(
        m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]);

    LogBufferDescriptor::checkTermLength(termLength);
    LogBufferDescriptor::checkPageSize(pageSize);

    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        m_buffers[i].wrap(basePtr + (i * termLength), termLength);
    }
}